

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Net.cpp
# Opt level: O2

void __thiscall CNet::CNet(CNet *this)

{
  CObject::CObject(&this->super_CObject);
  (this->super_CObject)._vptr_CObject = (_func_int **)&PTR__CNet_00188be8;
  (this->m_Wire).super__Vector_base<CWire_*,_std::allocator<CWire_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_Wire).super__Vector_base<CWire_*,_std::allocator<CWire_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_Wire).super__Vector_base<CWire_*,_std::allocator<CWire_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  CBBox::CBBox(&this->m_BBox);
  this->m_iNumPin = 0;
  this->m_ppPin = (CPin **)0x0;
  this->m_iMinWL = 0x7f7f7f7f;
  return;
}

Assistant:

CNet::CNet()
{
	//m_cWidth	=	1;
	m_iNumPin	=	0;
	m_ppPin		=	NULL;
	m_iMinWL	=	MAX_NUMBER;
//	m_iMinVia	=	0;
}